

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

char * mpack_node_data_alloc(mpack_node_t node,size_t maxlen)

{
  mpack_type_t mVar1;
  mpack_error_t mVar2;
  char *__src;
  mpack_node_data_t *pmVar3;
  char *ret;
  mpack_type_t type;
  size_t maxlen_local;
  mpack_node_t node_local;
  
  pmVar3 = node.data;
  mVar2 = mpack_node_error(node);
  if (mVar2 == mpack_ok) {
    mVar1 = pmVar3->type;
    if (((mVar1 == mpack_type_str) || (mVar1 == mpack_type_bin)) || (mVar1 == mpack_type_ext)) {
      if (maxlen < pmVar3->len) {
        mpack_node_flag_error(node,mpack_error_too_big);
        node_local.tree = (mpack_tree_t *)0x0;
      }
      else {
        node_local.tree = (mpack_tree_t *)malloc((ulong)pmVar3->len);
        if (node_local.tree == (mpack_tree_t *)0x0) {
          mpack_node_flag_error(node,mpack_error_memory);
          node_local.tree = (mpack_tree_t *)0x0;
        }
        else {
          __src = mpack_node_data_unchecked(node);
          memcpy(node_local.tree,__src,(ulong)pmVar3->len);
        }
      }
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      node_local.tree = (mpack_tree_t *)0x0;
    }
  }
  else {
    node_local.tree = (mpack_tree_t *)0x0;
  }
  return (char *)node_local.tree;
}

Assistant:

char* mpack_node_data_alloc(mpack_node_t node, size_t maxlen) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    // make sure this is a valid data type
    mpack_type_t type = node.data->type;
    if (type != mpack_type_str && type != mpack_type_bin && type != mpack_type_ext) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    if (node.data->len > maxlen) {
        mpack_node_flag_error(node, mpack_error_too_big);
        return NULL;
    }

    char* ret = (char*) MPACK_MALLOC((size_t)node.data->len);
    if (ret == NULL) {
        mpack_node_flag_error(node, mpack_error_memory);
        return NULL;
    }

    mpack_memcpy(ret, mpack_node_data_unchecked(node), node.data->len);
    return ret;
}